

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool handleArgument(int *argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  long in_RSI;
  int *in_RDI;
  int i;
  int local_1c;
  bool local_1;
  
  local_1c = 0;
  if (*in_RDI < 2) {
    fprintf(_stderr,"Usage: ./steiner <input> [-out <.out>] [-plot <.plt>]\n");
    local_1 = false;
  }
  else {
    while (local_1c < *in_RDI) {
      sVar2 = strlen(*(char **)(in_RSI + (long)local_1c * 8));
      if (sVar2 < 2) {
        local_1c = local_1c + 1;
      }
      else {
        iVar1 = strcmp((char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1),"plot");
        if (iVar1 == 0) {
          gDoplot = true;
          local_1c = local_1c + 1;
          std::__cxx11::string::operator=
                    ((string *)plotName_abi_cxx11_,*(char **)(in_RSI + (long)local_1c * 8));
        }
        else {
          iVar1 = strcmp((char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1),"out");
          if (iVar1 == 0) {
            gOutfile = true;
            local_1c = local_1c + 1;
            std::__cxx11::string::operator=
                      ((string *)outfileName_abi_cxx11_,*(char **)(in_RSI + (long)local_1c * 8));
          }
        }
        local_1c = local_1c + 1;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool handleArgument(const int& argc, char** argv) {
  int i = 0;
  if (argc < 2) {
    fprintf(stderr, "Usage: ./steiner <input> [-out <.out>] [-plot <.plt>]\n");
    return false;
  }
  while(i < argc) {
    if (strlen(argv[i]) <= 1) {
      ++i;
      continue;
    }
    else if (strcmp(argv[i] + 1, "plot") == 0) {
      gDoplot = true;
      plotName = argv[++i];
    }
    else if (strcmp(argv[i] + 1, "out") == 0) {
      gOutfile = true;
      outfileName = argv[++i];
    }
    ++i;
  }
  return true;
}